

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qspinbox.cpp
# Opt level: O1

QString * __thiscall
QSpinBox::textFromValue(QString *__return_storage_ptr__,QSpinBox *this,int value)

{
  uint uVar1;
  long lVar2;
  QArrayData *pQVar3;
  QArrayData *pQVar4;
  char16_t *pcVar5;
  qsizetype qVar6;
  uint uVar7;
  int iVar8;
  long in_FS_OFFSET;
  QLocale loc;
  QArrayData *local_a8;
  char16_t *pcStack_a0;
  qsizetype local_98;
  QStringBuilder<const_QLatin1String_&,_QString> local_88;
  QString local_68;
  QArrayData local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)&(this->super_QAbstractSpinBox).super_QWidget.field_0x8;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).size = 0;
  if (*(int *)(lVar2 + 0x3d4) == 10) {
    local_68.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::locale((QLocale *)&local_68,(QWidget *)this);
    uVar1 = *(uint *)(lVar2 + 0x3d0);
    uVar7 = QLocale::numberOptions();
    QLocale::setNumberOptions(&local_68,(uint)((uVar1 >> 9 & 1) == 0) | uVar7 & 0xfffffffe);
    QLocale::toString((longlong)&local_88);
    pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pQVar4 = (QArrayData *)(__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = (Data *)local_88.a;
    (__return_storage_ptr__->d).ptr = (char16_t *)local_88.b.d.d;
    pcVar5 = (char16_t *)(__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = (qsizetype)local_88.b.d.ptr;
    local_88.a = (QLatin1String *)pQVar3;
    local_88.b.d.d = (Data *)pQVar4;
    local_88.b.d.ptr = pcVar5;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    QLocale::~QLocale((QLocale *)&local_68);
  }
  else {
    local_48._0_8_ = ZEXT48((uint)value >> 0x1f);
    local_48.alloc = 0x66fd42;
    if (value < 0) {
      local_48.alloc = 0x67688e;
    }
    iVar8 = -value;
    if (0 < value) {
      iVar8 = value;
    }
    QString::number((int)&local_a8,iVar8);
    local_88.b.d.size = local_98;
    local_88.b.d.ptr = pcStack_a0;
    local_88.b.d.d = (Data *)local_a8;
    local_a8 = (QArrayData *)0x0;
    pcStack_a0 = (char16_t *)0x0;
    local_98 = 0;
    local_88.a = (QLatin1String *)&local_48;
    QStringBuilder<const_QLatin1String_&,_QString>::convertTo<QString>(&local_68,&local_88);
    pQVar3 = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar5 = (__return_storage_ptr__->d).ptr;
    *(undefined4 *)&(__return_storage_ptr__->d).d = local_68.d.d._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).d + 4) = local_68.d.d._4_4_;
    *(undefined4 *)&(__return_storage_ptr__->d).ptr = local_68.d.ptr._0_4_;
    *(undefined4 *)((long)&(__return_storage_ptr__->d).ptr + 4) = local_68.d.ptr._4_4_;
    qVar6 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_68.d.size;
    local_68.d.d = (Data *)pQVar3;
    local_68.d.ptr = pcVar5;
    local_68.d.size = qVar6;
    if (pQVar3 != (QArrayData *)0x0) {
      LOCK();
      (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar3->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar3->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar3,2,0x10);
      }
    }
    if (&(local_88.b.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_88.b.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_88.b.d.d)->super_QArrayData,2,0x10);
      }
    }
    if (local_a8 != (QArrayData *)0x0) {
      LOCK();
      (local_a8->ref_)._q_value.super___atomic_base<int>._M_i =
           (local_a8->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((local_a8->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(local_a8,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString QSpinBox::textFromValue(int value) const
{
    Q_D(const QSpinBox);
    QString str;

    if (d->displayIntegerBase != 10) {
        const auto prefix = value < 0 ? "-"_L1 : ""_L1;
        str = prefix + QString::number(qAbs(value), d->displayIntegerBase);
    } else {
        QLocale loc = locale();
        if (d->showGroupSeparator)
            loc.setNumberOptions(loc.numberOptions() & ~QLocale::OmitGroupSeparator);
        else
            loc.setNumberOptions(loc.numberOptions() | QLocale::OmitGroupSeparator);
        str = loc.toString(value);
    }

    return str;
}